

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

bool google::protobuf::internal::DateTimeToSeconds(DateTime *time,int64 *seconds)

{
  uint uVar1;
  uint uVar2;
  short sVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  
  uVar8 = time->year;
  if (0xffffd8f0 < uVar8 - 10000) {
    uVar1 = time->month;
    uVar4 = (ulong)uVar1;
    if (0xfffffff3 < uVar1 - 0xd) {
      uVar2 = time->day;
      if ((uint)time->second < 0x3c &&
          (((uint)time->minute < 0x3c && (uint)time->hour < 0x18) && 0xffffffe0 < uVar2 - 0x20)) {
        if ((uVar1 == 2) &&
           ((sVar3 = (short)uVar8, (ushort)((ushort)(sVar3 * 0x5c29) >> 4 | sVar3 * -0x7000) < 0xa4
            || (((uVar8 & 3) == 0 && ((short)(sVar3 + (short)((uVar8 & 0xffff) / 100) * -100) != 0))
               )))) {
          if (uVar2 < 0x1e) {
LAB_00252781:
            if (uVar8 < 0x191) {
              uVar6 = 1;
              lVar9 = 0;
            }
            else {
              uVar6 = (uVar8 - 1 & 0xffff) / 400;
              lVar9 = (ulong)uVar6 * 0x2f0605980;
              uVar6 = uVar6 * 400 + 1;
            }
            iVar5 = uVar8 - uVar6;
            if (99 < iVar5) {
              do {
                lVar10 = 0xbc191380;
                if ((int)uVar6 % 400 < 0x12d) {
                  lVar10 = 0xbc17c200;
                }
                if (uVar6 == ((int)uVar6 / 400) * 400) {
                  lVar10 = 0xbc191380;
                }
                lVar9 = lVar9 + lVar10;
                uVar6 = uVar6 + 100;
                iVar5 = iVar5 + -100;
              } while (99 < iVar5);
            }
            if (3 < iVar5) {
              iVar5 = uVar8 - uVar6;
              do {
                if (((int)uVar6 % 100 != 0 && (int)uVar6 % 100 < 0x61) ||
                   (lVar10 = 0x784ce00, (int)uVar6 % 400 == 0 || 0x18c < (int)uVar6 % 400)) {
                  lVar10 = 0x7861f80;
                }
                lVar9 = lVar9 + lVar10;
                uVar6 = uVar6 + 4;
                iVar5 = iVar5 + -4;
              } while (3 < iVar5);
            }
            uVar7 = uVar6;
            if ((int)uVar6 < (int)uVar8) {
              do {
                if (((uVar6 * -0x3d70a3d7 + 0x51eb850 >> 4 | uVar6 * -0x70000000) < 0xa3d70b) ||
                   ((lVar10 = 0x1e13380, (uVar6 & 3) == 0 && (uVar6 != ((int)uVar6 / 100) * 100))))
                {
                  lVar10 = 0x1e28500;
                }
                lVar9 = lVar9 + lVar10;
                uVar6 = uVar6 + 1;
                uVar7 = uVar8;
              } while (uVar8 != uVar6);
            }
            if (uVar1 - 1 < 0xc) {
              lVar9 = (long)*(int *)((anonymous_namespace)::kDaysSinceJan + uVar4 * 4) * 0x15180 +
                      lVar9;
              if (2 < uVar1) {
                uVar8 = uVar7 * -0x3d70a3d7 + 0x51eb850;
                if ((uVar8 >> 4 | uVar7 * -0x70000000) < 0xa3d70b) {
                  lVar9 = lVar9 + 0x15180;
                }
                else if (((uVar7 & 3) == 0) && (0x28f5c28 < (uVar8 >> 2 | uVar7 * 0x40000000))) {
                  lVar9 = lVar9 + 0x15180;
                }
              }
              if (0 < (int)uVar2) {
                if ((uVar1 == 2) &&
                   (((uVar7 * -0x3d70a3d7 + 0x51eb850 >> 4 | uVar7 * -0x70000000) < 0xa3d70b ||
                    (((uVar7 & 3) == 0 && (uVar7 != ((int)uVar7 / 100) * 100)))))) {
                  iVar5 = *(int *)((anonymous_namespace)::kDaysInMonth + uVar4 * 4) + 1;
                }
                else {
                  iVar5 = *(int *)((anonymous_namespace)::kDaysInMonth + uVar4 * 4);
                }
                if ((int)uVar2 <= iVar5) {
                  *seconds = lVar9 + (ulong)(uint)time->minute * 0x3c +
                                     (ulong)(uint)time->hour * 0xe10 + (ulong)(uVar2 - 1) * 0x15180
                                     + (ulong)(uint)time->second + -0xe7791f700;
                  return true;
                }
              }
              __assert_fail("time.day >= 1 && time.day <= (month == 2 && IsLeapYear(year) ? kDaysInMonth[month] + 1 : kDaysInMonth[month])"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/stubs/time.cc"
                            ,0x7b,
                            "int64 google::protobuf::internal::(anonymous namespace)::SecondsSinceCommonEra(const DateTime &)"
                           );
            }
            __assert_fail("time.month >= 1 && time.month <= 12",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/stubs/time.cc"
                          ,0x72,
                          "int64 google::protobuf::internal::(anonymous namespace)::SecondsSinceCommonEra(const DateTime &)"
                         );
          }
        }
        else if ((int)uVar2 <= *(int *)((anonymous_namespace)::kDaysInMonth + uVar4 * 4))
        goto LAB_00252781;
      }
    }
  }
  return false;
}

Assistant:

bool DateTimeToSeconds(const DateTime& time, int64* seconds) {
  if (!ValidateDateTime(time)) {
    return false;
  }
  *seconds = SecondsSinceCommonEra(time) - kSecondsFromEraToEpoch;
  return true;
}